

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O2

void __thiscall
duckdb::DecimalToString::FormatDecimal<duckdb::hugeint_t>
          (DecimalToString *this,hugeint_t value,uint8_t width,uint8_t scale,char *dst,idx_t len)

{
  char *pcVar2;
  char *ptr;
  char *pcVar3;
  uint64_t uVar4;
  undefined7 in_register_00000081;
  hugeint_t value_00;
  hugeint_t hVar5;
  hugeint_t minor;
  hugeint_t local_58;
  uint64_t local_48;
  hugeint_t local_40;
  DecimalToString *pDVar1;
  
  local_58.upper = value.lower;
  local_58.lower = (uint64_t)this;
  if (local_58.upper < 0) {
    Hugeint::NegateInPlace<true>(&local_58);
    *(undefined1 *)CONCAT71(in_register_00000081,scale) = 0x2d;
  }
  ptr = (undefined1 *)CONCAT71(in_register_00000081,scale) + (long)dst;
  uVar4 = local_58.upper;
  pDVar1 = (DecimalToString *)local_58.lower;
  if (width != '\0') {
    hVar5.upper = local_58.upper;
    hVar5.lower = local_58.lower;
    hVar5 = Hugeint::DivMod(hVar5,*(hugeint_t *)(Hugeint::POWERS_OF_TEN + (ulong)width * 0x10),
                            &local_40);
    local_48 = hVar5.upper;
    pDVar1 = (DecimalToString *)hVar5.lower;
    pcVar2 = NumericHelper::FormatUnsigned<duckdb::hugeint_t>(local_40,ptr);
    pcVar3 = ptr + -(ulong)width;
    while (ptr = pcVar2 + -1, pcVar3 < pcVar2) {
      *ptr = '0';
      pcVar2 = ptr;
    }
    *ptr = '.';
    uVar4 = local_48;
    if ((byte)value.upper <= width) {
      return;
    }
  }
  value_00.upper = uVar4;
  value_00.lower = (uint64_t)pDVar1;
  NumericHelper::FormatUnsigned<duckdb::hugeint_t>(value_00,ptr);
  return;
}

Assistant:

void DecimalToString::FormatDecimal(hugeint_t value, uint8_t width, uint8_t scale, char *dst, idx_t len) {
	auto endptr = dst + len;

	int negative = value.upper < 0;
	if (negative) {
		Hugeint::NegateInPlace(value);
		*dst = '-';
		dst++;
	}
	if (scale == 0) {
		// with scale=0 we format the number as a regular number
		NumericHelper::FormatUnsigned(value, endptr);
		return;
	}

	// we write two numbers:
	// the numbers BEFORE the decimal (major)
	// and the numbers AFTER the decimal (minor)
	hugeint_t minor;
	hugeint_t major = Hugeint::DivMod(value, Hugeint::POWERS_OF_TEN[scale], minor);

	// write the number after the decimal
	dst = NumericHelper::FormatUnsigned(minor, endptr);
	// (optionally) pad with zeros and add the decimal point
	while (dst > (endptr - scale)) {
		*--dst = '0';
	}
	*--dst = '.';
	// now write the part before the decimal
	D_ASSERT(width > scale || major == 0);
	if (width > scale) {
		dst = NumericHelper::FormatUnsigned(major, dst);
	}
}